

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# non_recursive_quick_sort.c
# Opt level: O0

void quick_sort(int *arr,int n)

{
  int l_00;
  int r_00;
  int iVar1;
  int iVar2;
  int v;
  int r;
  int l;
  int high [30];
  int local_98 [2];
  int low [30];
  int local_18;
  int sp;
  int n_local;
  int *arr_local;
  
  local_18 = 1;
  local_98[0] = 0;
  r = n + -1;
  iVar1 = local_18;
  while (local_18 = iVar1, 0 < local_18) {
    iVar1 = local_18 + -1;
    l_00 = local_98[iVar1];
    r_00 = (&r)[iVar1];
    if (l_00 < r_00) {
      iVar2 = partition(arr,l_00,r_00);
      if (iVar2 - l_00 < r_00 - iVar2) {
        local_98[iVar1] = iVar2 + 1;
        (&r)[iVar1] = r_00;
        local_98[local_18] = l_00;
        (&r)[local_18] = iVar2 + -1;
      }
      else {
        local_98[iVar1] = l_00;
        (&r)[iVar1] = iVar2 + -1;
        local_98[local_18] = iVar2 + 1;
        (&r)[local_18] = r_00;
      }
      local_18 = local_18 + 1;
      iVar1 = local_18;
    }
  }
  return;
}

Assistant:

void quick_sort(int arr[], int n) {
  int sp = 1;
  int low[30], high[30];

  low[0] = 0;
  high[0] = n - 1;

  while (sp > 0) {
    sp--;
    int l = low[sp];
    int r = high[sp];

    if (l >= r)
      ;
    else {
      int v = partition(arr, l, r);
      if (v - l < r - v) {
        low[sp] = v + 1;
        high[sp] = r;
        sp++;
        low[sp] = l;
        high[sp] = v - 1;
        sp++;
      } else {
        low[sp] = l;
        high[sp] = v - 1;
        sp++;
        low[sp] = v + 1;
        high[sp] = r;
        sp++;
      }
    }
  }
}